

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.cpp
# Opt level: O1

void __thiscall HEkkDual::iterationAnalysisData(HEkkDual *this)

{
  EdgeWeightMode EVar1;
  int iVar2;
  HEkk *pHVar3;
  HighsSimplexAnalysis *pHVar4;
  double dVar5;
  HighsInt HVar6;
  double *pdVar7;
  
  dVar5 = ldexp(1.0,-(this->ekk_instance_->options_->super_HighsOptionsStruct).cost_scale_factor);
  pHVar3 = this->ekk_instance_;
  pHVar4 = this->analysis;
  pHVar4->simplex_strategy = (pHVar3->info_).simplex_strategy;
  EVar1 = this->edge_weight_mode;
  pHVar4->edge_weight_mode = EVar1;
  iVar2 = this->solve_phase;
  pHVar4->solve_phase = iVar2;
  pHVar4->simplex_iteration_count = pHVar3->iteration_count_;
  pHVar4->devex_iteration_count = this->num_devex_iterations;
  HVar6 = this->variable_out;
  pHVar4->pivotal_row_index = this->row_out;
  pHVar4->leaving_variable = HVar6;
  pHVar4->entering_variable = this->variable_in;
  pHVar4->rebuild_reason = this->rebuild_reason;
  pHVar4->reduced_rhs_value = 0.0;
  pHVar4->reduced_cost_value = 0.0;
  pHVar4->edge_weight = 0.0;
  pHVar4->primal_delta = this->delta_primal;
  pHVar4->primal_step = this->theta_primal;
  pHVar4->dual_step = dVar5 * this->theta_dual;
  dVar5 = this->alpha_row;
  pHVar4->pivot_value_from_column = this->alpha_col;
  pHVar4->pivot_value_from_row = dVar5;
  pHVar4->factor_pivot_threshold = (pHVar3->info_).factor_pivot_threshold;
  pHVar4->numerical_trouble = this->numericalTrouble;
  pHVar4->edge_weight_error = pHVar3->edge_weight_error_;
  dVar5 = (pHVar3->info_).updated_dual_objective_value;
  pHVar4->objective_value = dVar5;
  if (iVar2 == 2) {
    pHVar4->objective_value = dVar5 * (double)(pHVar3->lp_).sense_;
  }
  pHVar4->num_primal_infeasibility = (pHVar3->info_).num_primal_infeasibilities;
  pHVar4->sum_primal_infeasibility = (pHVar3->info_).sum_primal_infeasibilities;
  if (iVar2 == 1) {
    pHVar4->num_dual_infeasibility = pHVar4->num_dual_phase_1_lp_dual_infeasibility;
    pdVar7 = &pHVar4->sum_dual_phase_1_lp_dual_infeasibility;
  }
  else {
    pHVar4->num_dual_infeasibility = (pHVar3->info_).num_dual_infeasibilities;
    pdVar7 = &(pHVar3->info_).sum_dual_infeasibilities;
  }
  pHVar4->sum_dual_infeasibility = *pdVar7;
  if ((EVar1 == kDevex) && (this->num_devex_iterations == 0)) {
    pHVar4->num_devex_framework = pHVar4->num_devex_framework + 1;
  }
  dVar5 = (pHVar3->info_).row_ep_density;
  pHVar4->col_aq_density = (pHVar3->info_).col_aq_density;
  pHVar4->row_ep_density = dVar5;
  dVar5 = (pHVar3->info_).row_DSE_density;
  pHVar4->row_ap_density = (pHVar3->info_).row_ap_density;
  pHVar4->row_DSE_density = dVar5;
  dVar5 = (pHVar3->info_).row_basic_feasibility_change_density;
  pHVar4->col_basic_feasibility_change_density =
       (pHVar3->info_).col_basic_feasibility_change_density;
  pHVar4->row_basic_feasibility_change_density = dVar5;
  dVar5 = (pHVar3->info_).primal_col_density;
  pHVar4->col_BFRT_density = (pHVar3->info_).col_BFRT_density;
  pHVar4->primal_col_density = dVar5;
  pHVar4->dual_col_density = (pHVar3->info_).dual_col_density;
  pHVar4->num_costly_DSE_iteration = (pHVar3->info_).num_costly_DSE_iteration;
  pHVar4->costly_DSE_measure = (pHVar3->info_).costly_DSE_measure;
  return;
}

Assistant:

void HEkkDual::iterationAnalysisData() {
  double cost_scale_factor =
      pow(2.0, -ekk_instance_.options_->cost_scale_factor);
  HighsSimplexInfo& info = ekk_instance_.info_;
  analysis->simplex_strategy = info.simplex_strategy;
  analysis->edge_weight_mode = edge_weight_mode;
  analysis->solve_phase = solve_phase;
  analysis->simplex_iteration_count = ekk_instance_.iteration_count_;
  analysis->devex_iteration_count = num_devex_iterations;
  analysis->pivotal_row_index = row_out;
  analysis->leaving_variable = variable_out;
  analysis->entering_variable = variable_in;
  analysis->rebuild_reason = rebuild_reason;
  analysis->reduced_rhs_value = 0;
  analysis->reduced_cost_value = 0;
  analysis->edge_weight = 0;
  analysis->primal_delta = delta_primal;
  analysis->primal_step = theta_primal;
  analysis->dual_step = theta_dual * cost_scale_factor;
  analysis->pivot_value_from_column = alpha_col;
  analysis->pivot_value_from_row = alpha_row;
  analysis->factor_pivot_threshold = info.factor_pivot_threshold;
  analysis->numerical_trouble = numericalTrouble;
  analysis->edge_weight_error = ekk_instance_.edge_weight_error_;
  analysis->objective_value = info.updated_dual_objective_value;
  // Since maximization is achieved by minimizing the LP with negated
  // costs, in phase 2 the dual objective value is negated, so flip
  // its sign according to the LP sense
  if (solve_phase == kSolvePhase2)
    analysis->objective_value *= (HighsInt)ekk_instance_.lp_.sense_;
  analysis->num_primal_infeasibility = info.num_primal_infeasibilities;
  analysis->sum_primal_infeasibility = info.sum_primal_infeasibilities;
  if (solve_phase == kSolvePhase1) {
    analysis->num_dual_infeasibility =
        analysis->num_dual_phase_1_lp_dual_infeasibility;
    analysis->sum_dual_infeasibility =
        analysis->sum_dual_phase_1_lp_dual_infeasibility;
  } else {
    analysis->num_dual_infeasibility = info.num_dual_infeasibilities;
    analysis->sum_dual_infeasibility = info.sum_dual_infeasibilities;
  }
  if ((edge_weight_mode == EdgeWeightMode::kDevex) &&
      (num_devex_iterations == 0))
    analysis->num_devex_framework++;
  analysis->col_aq_density = info.col_aq_density;
  analysis->row_ep_density = info.row_ep_density;
  analysis->row_ap_density = info.row_ap_density;
  analysis->row_DSE_density = info.row_DSE_density;
  analysis->col_basic_feasibility_change_density =
      info.col_basic_feasibility_change_density;
  analysis->row_basic_feasibility_change_density =
      info.row_basic_feasibility_change_density;
  analysis->col_BFRT_density = info.col_BFRT_density;
  analysis->primal_col_density = info.primal_col_density;
  analysis->dual_col_density = info.dual_col_density;
  analysis->num_costly_DSE_iteration = info.num_costly_DSE_iteration;
  analysis->costly_DSE_measure = info.costly_DSE_measure;
  //  analysis-> = info.;
}